

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

Gia_Man_t *
Gia_ManAreaBalance(Gia_Man_t *p,int fSimpleAnd,int nNewNodesMax,int fVerbose,int fVeryVerbose)

{
  int i;
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  Vec_Int_t *vCiLevels;
  
  if (p->vCiArrs == (Vec_Int_t *)0x0) {
    if (p->vInArrs != (Vec_Flt_t *)0x0) {
      if (p->And2Delay == 0) {
        fVar8 = 1.0;
      }
      else {
        fVar8 = (float)p->And2Delay;
      }
      for (iVar2 = 0; iVar2 < p->vCis->nSize; iVar2 = iVar2 + 1) {
        pGVar4 = Gia_ManCi(p,iVar2);
        iVar7 = Gia_ObjId(p,pGVar4);
        if (iVar7 == 0) break;
        pVVar3 = p->vLevels;
        fVar9 = Vec_FltEntry(p->vInArrs,iVar2);
        Vec_IntWriteEntry(pVVar3,iVar7,(int)(fVar9 / fVar8));
      }
    }
  }
  else {
    iVar2 = p->And2Delay;
    Vec_IntFreeP(&p->vLevels);
    pVVar3 = Vec_IntStart(p->nObjs);
    p->vLevels = pVVar3;
    for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
      pGVar4 = Gia_ManCi(p,iVar7);
      i = Gia_ObjId(p,pGVar4);
      if (i == 0) break;
      pVVar3 = p->vLevels;
      iVar1 = Vec_IntEntry(p->vCiArrs,iVar7);
      Vec_IntWriteEntry(pVVar3,i,iVar1 / (int)(iVar2 + (uint)(iVar2 == 0)));
    }
  }
  if ((p->pManTime != (void *)0x0) && (p->vLevels == (Vec_Int_t *)0x0)) {
    Gia_ManLevelWithBoxes(p);
  }
  pVVar3 = Gia_ManGetCiLevels(p);
  vCiLevels = pVVar3;
  if (p->vMapping == (Vec_Int_t *)0x0) {
    pGVar5 = Gia_ManDup(p);
  }
  else {
    pGVar5 = (Gia_Man_t *)Dsm_ManDeriveGia(p,0);
  }
  Gia_ManTransferTiming(pGVar5,p);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar5,(Gps_Par_t *)0x0);
  }
  if (fSimpleAnd == 0) {
    pGVar6 = Gia_ManDupMuxes(pGVar5,2);
  }
  else {
    pGVar6 = Gia_ManDup(pGVar5);
  }
  Gia_ManTransferTiming(pGVar6,pGVar5);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar6,(Gps_Par_t *)0x0);
  }
  if (pGVar5 != p) {
    Gia_ManStop(pGVar5);
  }
  pGVar5 = Dam_ManAreaBalanceInt(pGVar6,pVVar3,nNewNodesMax,fVerbose,fVeryVerbose);
  Gia_ManTransferTiming(pGVar5,pGVar6);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar5,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar6);
  Vec_IntFreeP(&vCiLevels);
  pGVar6 = Gia_ManDupNoMuxes(pGVar5,0);
  Gia_ManTransferTiming(pGVar6,pGVar5);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar6,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar5);
  iVar2 = Gia_ManIsNormalized(pGVar6);
  pGVar5 = pGVar6;
  if (iVar2 == 0) {
    pGVar5 = Gia_ManDupNormalize(pGVar6,0);
    Gia_ManTransferTiming(pGVar5,pGVar6);
    Gia_ManStop(pGVar6);
  }
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManAreaBalance( Gia_Man_t * p, int fSimpleAnd, int nNewNodesMax, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew0, * pNew, * pNew1, * pNew2;
    Vec_Int_t * vCiLevels;
    // set arrival times for the input of the new AIG
    if ( p->vCiArrs )
    {
        int i, Id, And2Delay = p->And2Delay ? p->And2Delay : 1;
        Vec_IntFreeP( &p->vLevels );
        p->vLevels = Vec_IntStart( Gia_ManObjNum(p) );
        Gia_ManForEachCiId( p, Id, i )
            Vec_IntWriteEntry( p->vLevels, Id, Vec_IntEntry(p->vCiArrs, i)/And2Delay );
    }
    else if ( p->vInArrs )
    {
        int i, Id, And2Delay = p->And2Delay ? p->And2Delay : 1;
        Gia_ManForEachCiId( p, Id, i )
            Vec_IntWriteEntry( p->vLevels, Id, (int)(Vec_FltEntry(p->vInArrs, i)/And2Delay) );
    }
    // determine CI levels
    if ( p->pManTime && p->vLevels == NULL )
        Gia_ManLevelWithBoxes( p );
    vCiLevels = Gia_ManGetCiLevels( p );
    // get the starting manager
    pNew0 = Gia_ManHasMapping(p) ? (Gia_Man_t *)Dsm_ManDeriveGia(p, 0) : Gia_ManDup(p);
    Gia_ManTransferTiming( pNew0, p );
    if ( fVerbose )     Gia_ManPrintStats( pNew0, NULL );
    // derive internal manager
    pNew = fSimpleAnd ? Gia_ManDup( pNew0 ) : Gia_ManDupMuxes( pNew0, 2 );
    Gia_ManTransferTiming( pNew, pNew0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    if ( pNew0 != p ) Gia_ManStop( pNew0 );
    // perform the operation
    pNew1 = Dam_ManAreaBalanceInt( pNew, vCiLevels, nNewNodesMax, fVerbose, fVeryVerbose );
    Gia_ManTransferTiming( pNew1, pNew );
    if ( fVerbose )     Gia_ManPrintStats( pNew1, NULL );
    Gia_ManStop( pNew );
    Vec_IntFreeP( &vCiLevels );
    // derive the final result
    pNew2 = Gia_ManDupNoMuxes( pNew1, 0 );
    Gia_ManTransferTiming( pNew2, pNew1 );
    if ( fVerbose )     Gia_ManPrintStats( pNew2, NULL );
    Gia_ManStop( pNew1 );
    // normalize if needed
    if ( !Gia_ManIsNormalized(pNew2) )
    {
        pNew2 = Gia_ManDupNormalize( pNew1 = pNew2, 0 );
        Gia_ManTransferTiming( pNew2, pNew1 );
        Gia_ManStop( pNew1 );
    }
    //Gia_ManTransferTiming( pNew2, p );
    return pNew2;
}